

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O2

int ccall_classify_struct(CTState *cts,CType *ct,int *rcl,CTSize ofs)

{
  uint uVar1;
  CType *pCVar2;
  ulong uVar3;
  uint ofs_00;
  
  if (0x10 < ct->size) {
    return 4;
  }
  while (uVar3 = (ulong)ct->sib, uVar3 != 0) {
    pCVar2 = cts->tab;
    ct = pCVar2 + uVar3;
    ofs_00 = pCVar2[uVar3].size + ofs;
    uVar1 = pCVar2[uVar3].info;
    if (uVar1 >> 0x1c == 10) {
      *(byte *)(rcl + (7 < ofs_00)) = *(byte *)(rcl + (7 < ofs_00)) | 1;
    }
    else if (uVar1 >> 0x1c == 9) {
      ccall_classify_ct(cts,pCVar2 + (uVar1 & 0xffff),rcl,ofs_00);
    }
    else if ((uVar1 & 0xf0ff0000) == 0x80030000) {
      ccall_classify_struct(cts,pCVar2 + (uVar1 & 0xffff),rcl,ofs_00);
    }
  }
  return (rcl[1] | *rcl) & 4;
}

Assistant:

static int ccall_classify_struct(CTState *cts, CType *ct, int *rcl, CTSize ofs)
{
  if (ct->size > 16) return CCALL_RCL_MEM;  /* Too big, gets memory class. */
  while (ct->sib) {
    CTSize fofs;
    ct = ctype_get(cts, ct->sib);
    fofs = ofs+ct->size;
    if (ctype_isfield(ct->info))
      ccall_classify_ct(cts, ctype_rawchild(cts, ct), rcl, fofs);
    else if (ctype_isbitfield(ct->info))
      rcl[(fofs >= 8)] |= CCALL_RCL_INT;  /* NYI: unaligned bitfields? */
    else if (ctype_isxattrib(ct->info, CTA_SUBTYPE))
      ccall_classify_struct(cts, ctype_rawchild(cts, ct), rcl, fofs);
  }
  return ((rcl[0]|rcl[1]) & CCALL_RCL_MEM);  /* Memory class? */
}